

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathFunction xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  xmlXPathFunction p_Var5;
  
  if (name != (xmlChar *)0x0 && ctxt != (xmlXPathContextPtr)0x0) {
    if (ns_uri == (xmlChar *)0x0) {
      uVar3 = xmlXPathSFComputeHash(name);
      uVar3 = uVar3 & 0x3f;
      while (bVar1 = xmlXPathSFHash[(int)uVar3], bVar1 != 0xff) {
        iVar4 = strcmp(xmlXPathStandardFunctions[bVar1].name,(char *)name);
        if (iVar4 == 0) {
          return xmlXPathStandardFunctions[bVar1].func;
        }
        bVar2 = 0x3e < (int)uVar3;
        uVar3 = uVar3 + 1;
        if (bVar2) {
          uVar3 = 0;
        }
      }
    }
    if ((ctxt->funcLookupFunc != (xmlXPathFuncLookupFunc)0x0) &&
       (p_Var5 = (*ctxt->funcLookupFunc)(ctxt->funcLookupData,name,ns_uri),
       p_Var5 != (xmlXPathFunction)0x0)) {
      return p_Var5;
    }
    if (ctxt->funcHash != (xmlHashTablePtr)0x0) {
      p_Var5 = (xmlXPathFunction)xmlHashLookup2(ctxt->funcHash,name,ns_uri);
      return p_Var5;
    }
  }
  return (xmlXPathFunction)0x0;
}

Assistant:

xmlXPathFunction
xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			 const xmlChar *ns_uri) {
    xmlXPathFunction ret;
    void *payload;

    if (ctxt == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);

    if (ns_uri == NULL) {
        int bucketIndex = xmlXPathSFComputeHash(name) % SF_HASH_SIZE;

        while (xmlXPathSFHash[bucketIndex] != UCHAR_MAX) {
            int funcIndex = xmlXPathSFHash[bucketIndex];

            if (strcmp(xmlXPathStandardFunctions[funcIndex].name,
                       (char *) name) == 0)
                return(xmlXPathStandardFunctions[funcIndex].func);

            bucketIndex += 1;
            if (bucketIndex >= SF_HASH_SIZE)
                bucketIndex = 0;
        }
    }

    if (ctxt->funcLookupFunc != NULL) {
	xmlXPathFuncLookupFunc f;

	f = ctxt->funcLookupFunc;
	ret = f(ctxt->funcLookupData, name, ns_uri);
	if (ret != NULL)
	    return(ret);
    }

    if (ctxt->funcHash == NULL)
	return(NULL);

    payload = xmlHashLookup2(ctxt->funcHash, name, ns_uri);
    memcpy(&ret, &payload, sizeof(payload));

    return(ret);
}